

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O2

void Image_Function::Threshold
               (Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,uint8_t threshold)

{
  uint uVar1;
  uint uVar2;
  uint8_t uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uchar *puVar6;
  ulong uVar7;
  ImageTemplate<unsigned_char> local_80;
  ImageTemplate<unsigned_char> local_58;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_58,out);
  VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_58);
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate(&local_80,out);
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>,PenguinV_Image::ImageTemplate<unsigned_char>>
            (&width,&height,in,&local_80);
  uVar3 = threshold;
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_80);
  uVar1 = out->_rowSize;
  uVar2 = in->_rowSize;
  puVar5 = out->_data + (ulong)startXOut + (ulong)(startYOut * uVar1);
  puVar4 = in->_data + (ulong)startXIn + (ulong)(startYIn * uVar2);
  puVar6 = puVar5 + height * uVar1;
  for (; puVar5 != puVar6; puVar5 = puVar5 + uVar1) {
    for (uVar7 = 0; width != uVar7; uVar7 = uVar7 + 1) {
      puVar5[uVar7] = (puVar4[uVar7] < uVar3) + 0xff;
    }
    puVar4 = puVar4 + uVar2;
  }
  return;
}

Assistant:

void Threshold( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
                    uint32_t width, uint32_t height, uint8_t threshold )
    {
        ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        VerifyGrayScaleImage( in, out );
        OptimiseRoi( width, height, in, out );

        const uint32_t rowSizeIn  = in.rowSize();
        const uint32_t rowSizeOut = out.rowSize();

        const uint8_t * inY  = in.data()  + startYIn  * rowSizeIn  + startXIn;
        uint8_t       * outY = out.data() + startYOut * rowSizeOut + startXOut;

        const uint8_t * outYEnd = outY + height * rowSizeOut;

        for( ; outY != outYEnd; outY += rowSizeOut, inY += rowSizeIn ) {
            const uint8_t * inX  = inY;
            uint8_t       * outX = outY;

            const uint8_t * outXEnd = outX + width;

            for( ; outX != outXEnd; ++outX, ++inX )
                (*outX) = (*inX) < threshold ? 0 : 255;
        }
    }